

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrDestroyHandTrackerEXT(XrHandTrackerEXT handTracker)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrHandTrackerEXT_T_*>::getWithInstanceInfo(&g_handtrackerext_info,handTracker);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyHandTrackerEXT)(handTracker);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrHandTrackerEXT_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_handtrackerext_info.
                super_HandleInfoBase<XrHandTrackerEXT_T_*,_GenValidUsageXrHandleInfo>,handTracker);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyHandTrackerEXT(
    XrHandTrackerEXT handTracker) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_handtrackerext_info.getWithInstanceInfo(handTracker);
        GenValidUsageXrHandleInfo *gen_handtrackerext_info = info_with_instance.first;
        (void)gen_handtrackerext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyHandTrackerEXT(handTracker);
        if (XR_SUCCEEDED(result)) {
            g_handtrackerext_info.erase(handTracker);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}